

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
          (SimulationDecPOMDPDiscrete *this,PlanningUnitDecPOMDPDiscrete *pu,int nrRuns,int seed,
          bool verbose)

{
  int in_ECX;
  int in_EDX;
  _func_int **in_RSI;
  Simulation *in_RDI;
  byte in_R8B;
  SimulationDecPOMDPDiscrete *unaff_retaddr;
  
  Simulation::Simulation(in_RDI,in_EDX,in_ECX);
  in_RDI->_vptr_Simulation = (_func_int **)&PTR__SimulationDecPOMDPDiscrete_00d0d788;
  in_RDI[1]._vptr_Simulation = in_RSI;
  in_RDI[1]._m_verbose = false;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  Simulation::SetVerbose(in_RDI,(bool)(in_R8B & 1));
  Initialize(unaff_retaddr);
  return;
}

Assistant:

SimulationDecPOMDPDiscrete::
SimulationDecPOMDPDiscrete(const PlanningUnitDecPOMDPDiscrete &pu, 
                           int nrRuns, int seed, bool verbose) : 
    Simulation(nrRuns, seed),
    _m_pu(&pu),
    _m_saveIntermediateResults(false)
{
    SetVerbose(verbose);
    Initialize();
}